

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O1

string * __thiscall
SLogLib::MemoryLogger::Messages_abi_cxx11_(string *__return_storage_ptr__,MemoryLogger *this)

{
  MemoryLoggerPriv *pMVar1;
  int iVar2;
  undefined8 uVar3;
  mutex *__mutex;
  MemoryLoggerPriv *pMVar4;
  stringstream _stream;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  __mutex = &this->mPriv->mMessagesMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    pMVar1 = this->mPriv;
    pMVar4 = pMVar1;
    while (pMVar4 = (MemoryLoggerPriv *)
                    (pMVar4->mMessages).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next, pMVar4 != pMVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,
                 (char *)(pMVar4->mMessages).
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size,
                 (pMVar4->mMessagesMutex).super___mutex_base._M_mutex.__align);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_system_error(iVar2);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

std::string MemoryLogger::Messages() const
{
	std::lock_guard<std::mutex> _lock(mPriv->mMessagesMutex);
	
	std::stringstream _stream;
	for(const std::string& _message : mPriv->mMessages)
	{
		_stream << _message;
	}
	return _stream.str();
}